

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O2

Function * __thiscall
TCV::getRightFunction
          (TCV *this,vector<Function_*,_std::allocator<Function_*>_> *__functions,ASTNode *_node)

{
  pointer ppFVar1;
  bool bVar2;
  ASTNode *_node_00;
  vector<Variable_*,_std::allocator<Variable_*>_> *pvVar3;
  const_reference ppVVar4;
  string *psVar5;
  reference rhs;
  Function *pFVar6;
  ulong __n;
  pointer ppFVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  callParams;
  string fType;
  
  _node_00 = AST::ASTNode::getChild(_node,1);
  getParamsType_abi_cxx11_(&callParams,this,_node_00);
  ppFVar7 = (__functions->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppFVar1 = (__functions->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppFVar7 == ppFVar1) {
      pFVar6 = (Function *)0x0;
LAB_00128070:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&callParams);
      return pFVar6;
    }
    pvVar3 = Function::getParams(*ppFVar7);
    if ((long)(pvVar3->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar3->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 ==
        (long)callParams.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)callParams.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5) {
      __n = 0;
      while( true ) {
        pvVar3 = Function::getParams(*ppFVar7);
        if ((ulong)((long)(pvVar3->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar3->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 3) <= __n) break;
        pvVar3 = Function::getParams(*ppFVar7);
        ppVVar4 = std::vector<Variable_*,_std::allocator<Variable_*>_>::at(pvVar3,__n);
        psVar5 = Variable::getType_abi_cxx11_(*ppVVar4);
        std::__cxx11::string::string((string *)&fType,(string *)psVar5);
        rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&callParams,__n);
        bVar2 = isMatchType(&fType,rhs);
        std::__cxx11::string::~string((string *)&fType);
        if (!bVar2) break;
        __n = __n + 1;
      }
      if ((long)callParams.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)callParams.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5 == (__n & 0xffffffff)) {
        pFVar6 = *ppFVar7;
        goto LAB_00128070;
      }
    }
    ppFVar7 = ppFVar7 + 1;
  } while( true );
}

Assistant:

Function *TCV::getRightFunction(const std::vector<Function *> &__functions, AST::ASTNode *_node) {
    auto callParams = getParamsType(_node->getChild(1));
    for (const auto &_function : __functions) {
        if (_function->getParams().size() != callParams.size()) continue;
        int matchedParams = 0;
        for (int i = 0; i < _function->getParams().size(); i++) {
            auto fType = _function->getParams().at(i)->getType();
            if (!isMatchType(fType, callParams.at(i))) break;
            else matchedParams++;
        }
        if (matchedParams == callParams.size()) return _function;
    }
    return nullptr;
}